

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_segregated_storage.hpp
# Opt level: O0

void __thiscall
boost::simple_segregated_storage<unsigned_long>::free
          (simple_segregated_storage<unsigned_long> *this,void *__ptr)

{
  void *pvVar1;
  void **ppvVar2;
  
  pvVar1 = this->first;
  ppvVar2 = nextof(__ptr);
  *ppvVar2 = pvVar1;
  this->first = __ptr;
  return;
}

Assistant:

void free BOOST_PREVENT_MACRO_SUBSTITUTION(void * const chunk)
    { //! Free a chunk.
      //! \pre chunk was previously returned from a malloc() referring to the same free list.
      //! \post !empty()
       BOOST_POOL_VALIDATE_INTERNALS
      nextof(chunk) = first;
      first = chunk;
      BOOST_POOL_VALIDATE_INTERNALS
    }